

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamANCF_3243::ChElementBeamANCF_3243(ChElementBeamANCF_3243 *this,void **vtt)

{
  ChLoadableU CVar1;
  ChLoadableUVW CVar2;
  _func_int **pp_Var3;
  undefined1 auVar4 [64];
  
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.super_ChKblock._vptr_ChKblock =
       (_func_int **)&PTR__ChKblockGeneric_00b3a868;
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data = (double *)0x0;
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows = 0;
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_ChElementBeam).super_ChElementGeneric.Kmatr.variables.
           super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl
           .super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_ChElementBeam).super_ChElementGeneric.Kmatr.variables.
           super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl
           .super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase =
       (_func_int **)&PTR__ChElementGeneric_00b31918;
  (this->super_ChElementBeam).mass = (double)SUB168(ZEXT416(0) << 0x40,0);
  (this->super_ChElementBeam).length = (double)SUB168(ZEXT416(0) << 0x40,8);
  auVar4 = ZEXT464(0) << 0x40;
  CVar1 = *(ChLoadableU *)(vtt + 1);
  this->super_ChLoadableU = CVar1;
  *(void **)((long)(this->m_GravForceScale).
                   super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
                   array + *(long *)((long)CVar1 + -0x78) + -0x70) = vtt[2];
  CVar2 = *(ChLoadableUVW *)(vtt + 3);
  this->super_ChLoadableUVW = CVar2;
  *(void **)((long)(this->m_GravForceScale).
                   super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
                   array + *(long *)((long)CVar2 + -0x78) + -0x68) = vtt[4];
  pp_Var3 = (_func_int **)*vtt;
  (this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase =
       pp_Var3;
  this->super_ChLoadableU = *(ChLoadableU *)(vtt + 5);
  *(void **)(pp_Var3[-3] +
            (long)&(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
                   _vptr_ChElementBase) = vtt[6];
  this->super_ChLoadableUVW = *(ChLoadableUVW *)(vtt + 7);
  this->m_method = ContInt;
  this->m_material = (shared_ptr<chrono::fea::ChMaterialBeamANCF>)auVar4._0_16_;
  this->m_nodes =
       (vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
        )auVar4._16_24_;
  this->m_lenX = (double)auVar4._40_8_;
  this->m_thicknessY = (double)auVar4._48_8_;
  this->m_thicknessZ = (double)auVar4._56_8_;
  *(undefined1 (*) [64])
   ((long)&(this->m_material).
           super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi + 1) = auVar4;
  this->m_SD = (Matrix<double,__1,__1,_1,__1,__1>)auVar4._0_24_;
  this->m_kGQ_D0 = (Matrix<double,__1,__1,_0,__1,__1>)auVar4._24_24_;
  (this->m_kGQ_Dv).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = (double *)auVar4._48_8_;
  (this->m_kGQ_Dv).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       = auVar4._56_8_;
  (this->m_kGQ_Dv).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
       = 0;
  this->m_O1 = (Matrix<double,__1,__1,_0,__1,__1>)auVar4._0_24_;
  this->m_O2 = (Matrix<double,__1,__1,_0,__1,__1>)auVar4._24_24_;
  (this->m_K3Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)auVar4._48_8_;
  (this->m_K3Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = auVar4._56_8_;
  *(undefined1 (*) [64])
   &(this->m_O2).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       auVar4;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
  ::resize(&this->m_nodes,2);
  return;
}

Assistant:

ChElementBeamANCF_3243::ChElementBeamANCF_3243()
    : m_method(IntFrcMethod::ContInt),
      m_lenX(0),
      m_thicknessY(0),
      m_thicknessZ(0),
      m_Alpha(0),
      m_damping_enabled(false) {
    m_nodes.resize(2);
}